

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_addr.cpp
# Opt level: O2

void __thiscall let::IpAddress::IpAddress(IpAddress *this,int port)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,"0.0.0.0",&local_11);
  this->port_ = port;
  this->is_ipv6_ = false;
  (this->field_3).addr_.sin_family = 2;
  (this->field_3).addr6_.sin6_flowinfo = 0;
  (this->field_3).addr_.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  return;
}

Assistant:

IpAddress::IpAddress(int port)
    : port_(port),
      ip_("0.0.0.0")
{
    addr_.sin_family = AF_INET;
    addr_.sin_addr.s_addr = INADDR_ANY;
    addr_.sin_port = htons(port);
}